

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O3

int64_t av1_estimate_txfm_yrd
                  (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,int64_t ref_best_rd,BLOCK_SIZE bs,
                  TX_SIZE tx_size)

{
  uint uVar1;
  uint uVar2;
  MB_MODE_INFO *pMVar3;
  MB_MODE_INFO *pMVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  TX_SIZE TVar10;
  byte bVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  byte bVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  bool bVar21;
  TXB_CTX txb_ctx;
  TxfmParam txfm_param;
  QUANT_PARAM quant_param;
  int64_t local_1c8;
  long local_1b0;
  int64_t local_158 [2];
  int64_t local_148;
  byte local_140;
  MB_MODE_INFO *local_138;
  RD_STATS *local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  TXB_CTX local_110;
  AV1_COMP *local_108;
  MACROBLOCK *local_100;
  ENTROPY_CONTEXT local_f8 [32];
  ENTROPY_CONTEXT local_d8 [32];
  undefined8 local_b8;
  long lStack_b0;
  int64_t iStack_a8;
  int64_t iStack_a0;
  byte local_98;
  undefined7 uStack_97;
  long local_90;
  int64_t local_88;
  int local_80;
  int local_7c;
  TxfmParam local_70;
  QUANT_PARAM local_58;
  
  local_138 = *(x->e_mbd).mi;
  bVar5 = true;
  if ((local_138->field_0xa7 & 0x80) == 0) {
    bVar5 = '\0' < local_138->ref_frame[0];
  }
  iVar12 = 0;
  if (((x->txfm_search_params).tx_mode_search_type != '\x02') ||
     (uVar13 = (ulong)local_138->bsize, iVar12 = 0, uVar13 == 0)) goto LAB_00235891;
  if (tx_size == '\0') {
    lVar7 = 0;
  }
  else {
    bVar11 = block_size_high[uVar13];
    if (block_size_high[uVar13] < block_size_wide[uVar13]) {
      bVar11 = block_size_wide[uVar13];
    }
    bVar15 = 1;
    uVar13 = 0x3f;
    if (bVar11 < 0x20) {
      if (bVar11 == 8) {
        TVar10 = '\x01';
        bVar15 = 0;
      }
      else {
        if (bVar11 != 0x10) goto LAB_00235883;
        TVar10 = '\x02';
      }
LAB_00235857:
      uVar13 = (ulong)(byte)(((""[tx_size] != TVar10 & bVar15) + TVar10 * -2) * '\x03' + 0x18);
    }
    else {
      TVar10 = '\x04';
      if ((bVar11 == 0x80) || (bVar11 == 0x40)) goto LAB_00235857;
      if (bVar11 == 0x20) {
        TVar10 = '\x03';
        goto LAB_00235857;
      }
    }
LAB_00235883:
    lVar7 = (ulong)(*(x->e_mbd).left_txfm_context <
                   *(byte *)((long)tx_size_high + (ulong)((uint)tx_size * 4))) +
            (ulong)(*(x->e_mbd).above_txfm_context <
                   *(byte *)((long)tx_size_wide + (ulong)((uint)tx_size * 4))) + uVar13;
  }
  iVar12 = (x->mode_costs).txfm_partition_cost[lVar7][0];
LAB_00235891:
  pMVar3 = (x->e_mbd).left_mbmi;
  pMVar4 = (x->e_mbd).above_mbmi;
  if (pMVar4 == (MB_MODE_INFO *)0x0) {
    uVar18 = 0;
  }
  else {
    uVar18 = (uint)pMVar4->skip_txfm;
  }
  if (pMVar3 == (MB_MODE_INFO *)0x0) {
    uVar14 = 0;
  }
  else {
    uVar14 = (uint)pMVar3->skip_txfm;
  }
  lVar7 = (long)(x->mode_costs).skip_txfm_cost[uVar14 + uVar18][1];
  iVar6 = x->rdmult;
  iVar8 = (x->mode_costs).skip_txfm_cost[uVar14 + uVar18][0] + iVar12;
  local_138->tx_size = tx_size;
  uVar18 = (uint)block_size_wide[bs];
  iVar19 = (x->e_mbd).mb_to_right_edge;
  if (iVar19 < 0) {
    uVar18 = (uint)block_size_wide[bs] +
             (iVar19 >> ((char)(x->e_mbd).plane[0].subsampling_x + 3U & 0x1f));
  }
  lVar17 = iVar6 * lVar7 + 0x100 >> 9;
  lVar16 = (long)iVar8 * (long)iVar6 + 0x100 >> 9;
  uVar14 = (uint)block_size_high[bs];
  iVar6 = (x->e_mbd).mb_to_bottom_edge;
  if (iVar6 < 0) {
    uVar14 = (uint)block_size_high[bs] +
             (iVar6 >> ((char)(x->e_mbd).plane[0].subsampling_y + 3U & 0x1f));
  }
  uVar1 = *(uint *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
  uVar2 = *(uint *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
  local_1c8 = 0x7fffffffffffffff;
  lVar20 = 0;
  local_130 = rd_stats;
  memset(local_f8,0,0x88);
  local_90 = lVar17;
  if (lVar16 < lVar17) {
    local_90 = lVar16;
  }
  lStack_b0 = 0;
  iStack_a8 = 0;
  iStack_a0 = 0;
  local_98 = 1;
  local_108 = cpi;
  local_100 = x;
  local_88 = ref_best_rd;
  av1_get_entropy_contexts(bs,(x->e_mbd).plane,local_f8,local_d8);
  bVar21 = local_7c == 0;
  if (0 < (int)uVar14 >> 2 && bVar21) {
    local_118 = (ulong)((uVar2 & 0xff) * (uVar1 & 0xff));
    local_120 = (ulong)(uVar1 & 0xff);
    local_128 = (ulong)(uVar2 & 0xff);
    local_1b0 = 0;
    do {
      if (0 < (int)uVar18 >> 2) {
        lVar20 = (long)(int)lVar20;
        lVar16 = 0;
        do {
          local_158[0] = 0;
          local_158[1] = 0;
          local_148 = 0;
          local_140 = 1;
          if (local_80 != 0) {
            local_7c = 1;
            break;
          }
          get_txb_ctx(bs,tx_size,0,local_f8 + lVar16,local_d8 + local_1b0,&local_110);
          av1_setup_xform(&cpi->common,x,tx_size,'\0',&local_70);
          av1_setup_quant(tx_size,0,1,0,&local_58);
          iVar19 = (int)lVar20;
          av1_xform(x,0,iVar19,(int)local_1b0,(int)lVar16,bs,&local_70);
          av1_quant(x,0,iVar19,&local_70,&local_58);
          iVar6 = av1_cost_coeffs_txb(x,0,iVar19,tx_size,local_70.tx_type,&local_110,0);
          dist_block_tx_domain
                    (x,0,iVar19,tx_size,local_58.qmatrix,
                     av1_scan_orders[local_70.tx_size][local_70.tx_type].scan,local_158,&local_148);
          if (iVar6 == 0x7fffffff || (long)(int)local_b8 == 0x7fffffff) {
            local_b8 = 0x7fffffff;
            lStack_b0 = 0x7fffffffffffffff;
            iStack_a8 = 0x7fffffffffffffff;
            iStack_a0 = 0x7fffffffffffffff;
            local_98 = 0;
          }
          else {
            uVar13 = (long)(int)local_b8 + (long)iVar6;
            if (0x7ffffffe < (long)uVar13) {
              uVar13 = 0x7fffffff;
            }
            local_b8 = CONCAT44(local_b8._4_4_,(int)uVar13);
            if (local_b8._4_4_ == 0) {
              local_b8 = uVar13 & 0xffffffff;
            }
            lStack_b0 = lStack_b0 + local_158[0];
            if (local_148 != 0x7fffffffffffffff && iStack_a0 != 0x7fffffffffffffff) {
              iStack_a0 = iStack_a0 + local_148;
            }
            local_98 = local_98 & x->plane[0].eobs[lVar20] == 0 & local_140;
          }
          lVar9 = local_158[0] * 0x80 + ((long)x->rdmult * (long)iVar6 + 0x100 >> 9);
          lVar17 = local_148 * 0x80;
          if (lVar9 < local_148 * 0x80) {
            lVar17 = lVar9;
          }
          local_90 = lVar17 + local_90;
          if (ref_best_rd < local_90) {
            local_80 = 1;
            break;
          }
          bVar11 = x->plane[0].txb_entropy_ctx[lVar20];
          memset(local_f8 + lVar16,(uint)bVar11,(long)(int)uVar1);
          memset(local_d8 + local_1b0,(uint)bVar11,(long)(int)uVar2);
          lVar20 = lVar20 + local_118;
          lVar16 = lVar16 + local_120;
        } while ((int)lVar16 < (int)uVar18 >> 2);
      }
      local_1b0 = local_1b0 + local_128;
      bVar21 = local_7c == 0;
    } while (((int)local_1b0 < (int)uVar14 >> 2) && (local_7c == 0));
  }
  if (!bVar21) {
    local_b8 = 0x7fffffff;
    lStack_b0 = 0x7fffffffffffffff;
    iStack_a8 = 0x7fffffffffffffff;
    iStack_a0 = 0x7fffffffffffffff;
    local_98 = 0;
  }
  local_130->rate = (int)local_b8;
  local_130->zero_rate = local_b8._4_4_;
  local_130->dist = lStack_b0;
  *(ulong *)&local_130->skip_txfm = CONCAT71(uStack_97,local_98);
  local_130->rdcost = iStack_a8;
  local_130->sse = iStack_a0;
  iVar6 = local_130->rate;
  if (iVar6 != 0x7fffffff) {
    if ((bool)(local_130->skip_txfm != '\0' & bVar5)) {
      local_1c8 = local_130->sse * 0x80 + (x->rdmult * lVar7 + 0x100 >> 9);
    }
    else {
      iVar19 = x->rdmult;
      local_1c8 = local_130->dist * 0x80 + ((long)(iVar8 + iVar6) * (long)iVar19 + 0x100 >> 9);
      local_130->rate = iVar12 + iVar6;
      if ((bVar5 && local_130->skip_txfm == '\0') &&
         ((x->e_mbd).lossless[*(ushort *)&local_138->field_0xa7 & 7] == 0)) {
        lVar7 = local_130->sse * 0x80 + (iVar19 * lVar7 + 0x100 >> 9);
        if (lVar7 <= local_1c8) {
          local_130->rate = 0;
          local_130->dist = local_130->sse;
          local_130->skip_txfm = '\x01';
          local_1c8 = lVar7;
        }
      }
    }
  }
  return local_1c8;
}

Assistant:

int64_t av1_estimate_txfm_yrd(const AV1_COMP *const cpi, MACROBLOCK *x,
                              RD_STATS *rd_stats, int64_t ref_best_rd,
                              BLOCK_SIZE bs, TX_SIZE tx_size) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int is_inter = is_inter_block(mbmi);
  const int tx_select = txfm_params->tx_mode_search_type == TX_MODE_SELECT &&
                        block_signals_txsize(mbmi->bsize);
  int tx_size_rate = 0;
  if (tx_select) {
    const int ctx = txfm_partition_context(
        xd->above_txfm_context, xd->left_txfm_context, mbmi->bsize, tx_size);
    tx_size_rate = mode_costs->txfm_partition_cost[ctx][0];
  }
  const int skip_ctx = av1_get_skip_txfm_context(xd);
  const int no_skip_txfm_rate = mode_costs->skip_txfm_cost[skip_ctx][0];
  const int skip_txfm_rate = mode_costs->skip_txfm_cost[skip_ctx][1];
  const int64_t skip_txfm_rd = RDCOST(x->rdmult, skip_txfm_rate, 0);
  const int64_t no_this_rd =
      RDCOST(x->rdmult, no_skip_txfm_rate + tx_size_rate, 0);
  mbmi->tx_size = tx_size;

  const uint8_t txw_unit = tx_size_wide_unit[tx_size];
  const uint8_t txh_unit = tx_size_high_unit[tx_size];
  const int step = txw_unit * txh_unit;
  const int max_blocks_wide = max_block_wide(xd, bs, 0);
  const int max_blocks_high = max_block_high(xd, bs, 0);

  struct rdcost_block_args args;
  av1_zero(args);
  args.x = x;
  args.cpi = cpi;
  args.best_rd = ref_best_rd;
  args.current_rd = AOMMIN(no_this_rd, skip_txfm_rd);
  av1_init_rd_stats(&args.rd_stats);
  av1_get_entropy_contexts(bs, &xd->plane[0], args.t_above, args.t_left);
  int i = 0;
  for (int blk_row = 0; blk_row < max_blocks_high && !args.incomplete_exit;
       blk_row += txh_unit) {
    for (int blk_col = 0; blk_col < max_blocks_wide; blk_col += txw_unit) {
      RD_STATS this_rd_stats;
      av1_init_rd_stats(&this_rd_stats);

      if (args.exit_early) {
        args.incomplete_exit = 1;
        break;
      }

      ENTROPY_CONTEXT *a = args.t_above + blk_col;
      ENTROPY_CONTEXT *l = args.t_left + blk_row;
      TXB_CTX txb_ctx;
      get_txb_ctx(bs, tx_size, 0, a, l, &txb_ctx);

      TxfmParam txfm_param;
      QUANT_PARAM quant_param;
      av1_setup_xform(&cpi->common, x, tx_size, DCT_DCT, &txfm_param);
      av1_setup_quant(tx_size, 0, AV1_XFORM_QUANT_B, 0, &quant_param);

      av1_xform(x, 0, i, blk_row, blk_col, bs, &txfm_param);
      av1_quant(x, 0, i, &txfm_param, &quant_param);

      this_rd_stats.rate =
          cost_coeffs(x, 0, i, tx_size, txfm_param.tx_type, &txb_ctx, 0);

      const SCAN_ORDER *const scan_order =
          get_scan(txfm_param.tx_size, txfm_param.tx_type);
      dist_block_tx_domain(x, 0, i, tx_size, quant_param.qmatrix,
                           scan_order->scan, &this_rd_stats.dist,
                           &this_rd_stats.sse);

      const int64_t no_skip_txfm_rd =
          RDCOST(x->rdmult, this_rd_stats.rate, this_rd_stats.dist);
      const int64_t skip_rd = RDCOST(x->rdmult, 0, this_rd_stats.sse);

      this_rd_stats.skip_txfm &= !x->plane[0].eobs[i];

      av1_merge_rd_stats(&args.rd_stats, &this_rd_stats);
      args.current_rd += AOMMIN(no_skip_txfm_rd, skip_rd);

      if (args.current_rd > ref_best_rd) {
        args.exit_early = 1;
        break;
      }

      av1_set_txb_context(x, 0, i, tx_size, a, l);
      i += step;
    }
  }

  if (args.incomplete_exit) av1_invalid_rd_stats(&args.rd_stats);

  *rd_stats = args.rd_stats;
  if (rd_stats->rate == INT_MAX) return INT64_MAX;

  int64_t rd;
  // rdstats->rate should include all the rate except skip/non-skip cost as the
  // same is accounted in the caller functions after rd evaluation of all
  // planes. However the decisions should be done after considering the
  // skip/non-skip header cost
  if (rd_stats->skip_txfm && is_inter) {
    rd = RDCOST(x->rdmult, skip_txfm_rate, rd_stats->sse);
  } else {
    // Intra blocks are always signalled as non-skip
    rd = RDCOST(x->rdmult, rd_stats->rate + no_skip_txfm_rate + tx_size_rate,
                rd_stats->dist);
    rd_stats->rate += tx_size_rate;
  }
  // Check if forcing the block to skip transform leads to smaller RD cost.
  if (is_inter && !rd_stats->skip_txfm && !xd->lossless[mbmi->segment_id]) {
    int64_t temp_skip_txfm_rd =
        RDCOST(x->rdmult, skip_txfm_rate, rd_stats->sse);
    if (temp_skip_txfm_rd <= rd) {
      rd = temp_skip_txfm_rd;
      rd_stats->rate = 0;
      rd_stats->dist = rd_stats->sse;
      rd_stats->skip_txfm = 1;
    }
  }

  return rd;
}